

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockETC21BitAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alphaimg,int width,int height,
               int startx,int starty,int channelsRGB)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint height_00;
  int y;
  int iVar9;
  uint8 *alpha;
  
  alpha = img + 3;
  if (channelsRGB == 3) {
    alpha = alphaimg;
  }
  height_00 = block_part1 >> 0xb & 0x1f;
  uVar3 = block_part1 << 5;
  uVar8 = ((int)uVar3 >> 0x1d) + (block_part1 >> 0x1b);
  uVar2 = ((int)(block_part1 << 0x15) >> 0x1d) + height_00;
  if ((block_part1 & 2) == 0) {
    if (uVar8 < 0x20) {
      uVar8 = ((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f);
      if (uVar8 < 0x20) {
        if (uVar2 < 0x20) {
          decompressBlockDifferentialWithAlphaC
                    (block_part1,block_part2,img,alpha,width,uVar8,startx,starty,channelsRGB);
          return;
        }
        decompressBlockPlanar57c
                  ((block_part1 & 0x3fc) << 6 |
                   uVar3 & 0x30000 | (block_part1 & 0x7f0000) * 4 + (block_part1 & 0xff000000) * 2 |
                   (block_part1 & 1) << 7 | block_part2 >> 0x19,block_part2 << 7,img,width,
                   block_part2 >> 0x19,startx,starty,channelsRGB);
        sVar1 = (channelsRGB != 3) * '\x02';
        iVar9 = (starty + 3) * width + startx;
        iVar7 = (starty + 2) * width + startx;
        iVar6 = (starty + 1) * width + startx;
        iVar4 = starty * width + startx;
        iVar5 = startx + -1;
        do {
          alpha[iVar4 << sVar1] = 0xff;
          alpha[iVar6 << sVar1] = 0xff;
          alpha[iVar7 << sVar1] = 0xff;
          alpha[iVar9 << sVar1] = 0xff;
          iVar9 = iVar9 + 1;
          iVar7 = iVar7 + 1;
          iVar6 = iVar6 + 1;
          iVar4 = iVar4 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 < startx + 3);
      }
      else {
        decompressBlockTHUMB58HAlphaC
                  (block_part1 >> 1 & 0x1fffe |
                   block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000,
                   block_part2,img,alpha,width,uVar8,startx,starty,channelsRGB);
      }
    }
    else {
      decompressBlockTHUMB59TAlphaC
                (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
                 block_part2,img,alpha,width,height_00,startx,starty,channelsRGB);
    }
  }
  else {
    if (uVar8 < 0x20) {
      uVar8 = ((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f);
      if (uVar8 < 0x20) {
        if (uVar2 < 0x20) {
          decompressBlockDifferentialWithAlphaC
                    (block_part1,block_part2,img,alpha,width,uVar8,startx,starty,channelsRGB);
        }
        else {
          decompressBlockPlanar57c
                    ((block_part1 & 0x3fc) << 6 |
                     uVar3 & 0x30000 | (block_part1 & 0x7f0000) * 4 + (block_part1 & 0xff000000) * 2
                     | (block_part1 & 1) << 7 | block_part2 >> 0x19,block_part2 << 7,img,width,
                     block_part2 >> 0x19,startx,starty,channelsRGB);
        }
      }
      else {
        uVar2 = block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000;
        decompressBlockTHUMB58Hc
                  (block_part1 >> 1 & 0x1fffe | uVar2,block_part2,img,width,uVar2,startx,starty,
                   channelsRGB);
      }
    }
    else {
      decompressBlockTHUMB59Tc
                (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
                 block_part2,img,width,uVar8,startx,starty,channelsRGB);
    }
    sVar1 = (channelsRGB != 3) * '\x02';
    iVar9 = (starty + 3) * width + startx;
    iVar7 = (starty + 2) * width + startx;
    iVar6 = (starty + 1) * width + startx;
    iVar4 = starty * width + startx;
    iVar5 = startx + -1;
    do {
      alpha[iVar4 << sVar1] = 0xff;
      alpha[iVar6 << sVar1] = 0xff;
      alpha[iVar7 << sVar1] = 0xff;
      alpha[iVar9 << sVar1] = 0xff;
      iVar9 = iVar9 + 1;
      iVar7 = iVar7 + 1;
      iVar6 = iVar6 + 1;
      iVar4 = iVar4 + 1;
      iVar5 = iVar5 + 1;
    } while (iVar5 < startx + 3);
  }
  return;
}

Assistant:

void decompressBlockETC21BitAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alphaimg, int width, int height, int startx, int starty, int channelsRGB)
{
	int diffbit;
	signed char color1[3];
	signed char diff[3];
	signed char red, green, blue;
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alphaimg = &img[0+3];
  }

	diffbit = (GETBITSHIGH(block_part1, 1, 33));

	if( diffbit )
	{
		// We have diffbit = 1, meaning no transparent pixels. regular decompression.

		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];

		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59Tc(block59_part1, block59_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if (green < 0 || green > 31)
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58Hc(block58_part1, block58_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
		}
		else
		{
 			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		for(int x=startx; x<startx+4; x++) 
		{
			for(int y=starty; y<starty+4; y++) 
			{
				alphaimg[channelsA*(x+y*width)]=255;
			}
		}
	}
	else
	{
		// We have diffbit = 0, transparent pixels. Only T-, H- or regular diff-mode possible.
		
		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];
		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59TAlphaC(block59_part1, block59_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(green < 0 || green > 31) 
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58HAlphaC(block58_part1, block58_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
			for(int x=startx; x<startx+4; x++) 
			{
				for(int y=starty; y<starty+4; y++) 
				{
					alphaimg[channelsA*(x+y*width)]=255;
				}
			}
		}
		else
			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img,alphaimg, width, height, startx, starty, channelsRGB);
	}
}